

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_absolute_indexed_instructions.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_598a4::CpuAbsoluteIndexedTest_sre_absy_sets_c_without_pagecrossing_Test::
~CpuAbsoluteIndexedTest_sre_absy_sets_c_without_pagecrossing_Test
          (CpuAbsoluteIndexedTest_sre_absy_sets_c_without_pagecrossing_Test *this)

{
  CpuAbsoluteIndexedTest_sre_absy_sets_c_without_pagecrossing_Test *this_local;
  
  ~CpuAbsoluteIndexedTest_sre_absy_sets_c_without_pagecrossing_Test(this);
  operator_delete(this,0x118);
  return;
}

Assistant:

TEST_F(CpuAbsoluteIndexedTest, sre_absy_sets_c_without_pagecrossing) {
    registers.p = Z_FLAG;
    registers.a = 0b01110011;
    expected.a = 0b00110011;
    expected.p = C_FLAG;
    memory_content = 0b10000001;
    run_readwrite_instruction_without_pagecrossing(
            SRE_ABSY, IndexReg::Y, 0b01000000);
}